

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O3

int ffs2dt(char *datestr,int *year,int *month,int *day,int *status)

{
  ushort *puVar1;
  int iVar2;
  int month_00;
  int day_00;
  size_t sVar3;
  ushort **ppuVar4;
  
  if (0 < *status) {
    return *status;
  }
  if (year != (int *)0x0) {
    *year = 0;
  }
  if (month != (int *)0x0) {
    *month = 0;
  }
  if (day != (int *)0x0) {
    *day = 0;
  }
  if (datestr == (char *)0x0) {
    datestr = "error: null input date string (ffs2dt)";
  }
  else {
    sVar3 = strlen(datestr);
    iVar2 = (int)sVar3;
    if (iVar2 == 8) {
      if ((datestr[2] == '/') && (datestr[5] == '/')) {
        ppuVar4 = __ctype_b_loc();
        puVar1 = *ppuVar4;
        if (((*(byte *)((long)puVar1 + (long)*datestr * 2 + 1) & 8) != 0) &&
           (((((*(byte *)((long)puVar1 + (long)datestr[1] * 2 + 1) & 8) != 0 &&
              ((*(byte *)((long)puVar1 + (long)datestr[3] * 2 + 1) & 8) != 0)) &&
             ((*(byte *)((long)puVar1 + (long)datestr[4] * 2 + 1) & 8) != 0)) &&
            (((*(byte *)((long)puVar1 + (long)datestr[6] * 2 + 1) & 8) != 0 &&
             ((*(byte *)((long)puVar1 + (long)datestr[7] * 2 + 1) & 8) != 0)))))) {
          iVar2 = atoi(datestr + 6);
          iVar2 = iVar2 + 0x76c;
          month_00 = atoi(datestr + 3);
          day_00 = atoi(datestr);
          if (year != (int *)0x0) {
            *year = iVar2;
          }
          if (month != (int *)0x0) {
            *month = month_00;
          }
joined_r0x001b0380:
          if (day != (int *)0x0) {
            *day = day_00;
          }
          iVar2 = ffverifydate(iVar2,month_00,day_00,status);
          if (0 < iVar2) {
            ffpmsg("invalid date (ffs2dt)");
          }
          return *status;
        }
      }
    }
    else if (((9 < iVar2) && (datestr[4] == '-')) && (datestr[7] == '-')) {
      ppuVar4 = __ctype_b_loc();
      puVar1 = *ppuVar4;
      if ((((((*(byte *)((long)puVar1 + (long)*datestr * 2 + 1) & 8) != 0) &&
            ((*(byte *)((long)puVar1 + (long)datestr[1] * 2 + 1) & 8) != 0)) &&
           (((*(byte *)((long)puVar1 + (long)datestr[2] * 2 + 1) & 8) != 0 &&
            (((*(byte *)((long)puVar1 + (long)datestr[3] * 2 + 1) & 8) != 0 &&
             ((*(byte *)((long)puVar1 + (long)datestr[5] * 2 + 1) & 8) != 0)))))) &&
          ((*(byte *)((long)puVar1 + (long)datestr[6] * 2 + 1) & 8) != 0)) &&
         ((((*(byte *)((long)puVar1 + (long)datestr[8] * 2 + 1) & 8) != 0 &&
           ((*(byte *)((long)puVar1 + (long)datestr[9] * 2 + 1) & 8) != 0)) &&
          ((iVar2 == 10 || (datestr[10] == 'T')))))) {
        iVar2 = atoi(datestr);
        month_00 = atoi(datestr + 5);
        day_00 = atoi(datestr + 8);
        if (year != (int *)0x0) {
          *year = iVar2;
        }
        if (month != (int *)0x0) {
          *month = month_00;
        }
        goto joined_r0x001b0380;
      }
    }
    ffpmsg("input date string has illegal format (ffs2dt):");
  }
  ffpmsg(datestr);
  *status = 0x1a4;
  return 0x1a4;
}

Assistant:

int ffs2dt(char *datestr,   /* I - date string: "YYYY-MM-DD" or "dd/mm/yy" */
           int *year,       /* O - year (0 - 9999)                         */
           int *month,      /* O - month (1 - 12)                          */
           int *day,        /* O - day (1 - 31)                            */
           int   *status)   /* IO - error status                           */
/*
  Parse a date character string into year, month, and day values
*/
{
    int slen, lyear, lmonth, lday;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (year)
        *year = 0;
    if (month)
        *month = 0;
    if (day)
        *day   = 0;

    if (!datestr)
    {
        ffpmsg("error: null input date string (ffs2dt)");
        return(*status = BAD_DATE);   /* Null datestr pointer ??? */
    }

    slen = strlen(datestr);

    if (slen == 8 && datestr[2] == '/' && datestr[5] == '/')
    {
        if (isdigit((int) datestr[0]) && isdigit((int) datestr[1])
         && isdigit((int) datestr[3]) && isdigit((int) datestr[4])
         && isdigit((int) datestr[6]) && isdigit((int) datestr[7]) )
        {
            /* this is an old format string: "dd/mm/yy" */
            lyear  = atoi(&datestr[6]) + 1900;
            lmonth = atoi(&datestr[3]);
	    lday   = atoi(datestr);
	    
            if (year)
                *year = lyear;
            if (month)
                *month = lmonth;
            if (day)
                *day   = lday;
        }
        else
        {
            ffpmsg("input date string has illegal format (ffs2dt):");
            ffpmsg(datestr);
            return(*status = BAD_DATE);
        }
    }
    else if (slen >= 10 && datestr[4] == '-' && datestr[7] == '-')
        {
        if (isdigit((int) datestr[0]) && isdigit((int) datestr[1])
         && isdigit((int) datestr[2]) && isdigit((int) datestr[3])
         && isdigit((int) datestr[5]) && isdigit((int) datestr[6])
         && isdigit((int) datestr[8]) && isdigit((int) datestr[9]) )
        {
            if (slen > 10 && datestr[10] != 'T')
            {
                ffpmsg("input date string has illegal format (ffs2dt):");
                ffpmsg(datestr);
                return(*status = BAD_DATE);
            }

            /* this is a new format string: "yyyy-mm-dd" */
            lyear  = atoi(datestr);
            lmonth = atoi(&datestr[5]);
            lday   = atoi(&datestr[8]);

            if (year)
               *year  = lyear;
            if (month)
               *month = lmonth;
            if (day)
               *day   = lday;
        }
        else
        {
                ffpmsg("input date string has illegal format (ffs2dt):");
                ffpmsg(datestr);
                return(*status = BAD_DATE);
        }
    }
    else
    {
                ffpmsg("input date string has illegal format (ffs2dt):");
                ffpmsg(datestr);
                return(*status = BAD_DATE);
    }


    if (ffverifydate(lyear, lmonth, lday, status) > 0)
    {
        ffpmsg("invalid date (ffs2dt)");
    }

    return(*status);
}